

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolData.cpp
# Opt level: O0

void __thiscall SymbolData::clear(SymbolData *this)

{
  undefined1 local_78 [8];
  SymDataModule defaultModule;
  SymbolData *this_local;
  
  this->enabled = true;
  defaultModule.data._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  ghc::filesystem::path::clear(&this->nocashSymFileName);
  std::vector<SymDataModule,_std::allocator<SymDataModule>_>::clear(&this->modules);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->files);
  this->currentModule = 0;
  this->currentFunction = -1;
  SymDataModule::SymDataModule((SymDataModule *)local_78);
  local_78 = (undefined1  [8])0x0;
  std::vector<SymDataModule,_std::allocator<SymDataModule>_>::push_back
            (&this->modules,(SymDataModule *)local_78);
  SymDataModule::~SymDataModule((SymDataModule *)local_78);
  return;
}

Assistant:

void SymbolData::clear()
{
	enabled = true;
	nocashSymFileName.clear();
	modules.clear();
	files.clear();
	currentModule = 0;
	currentFunction = -1;
	
	SymDataModule defaultModule;
	defaultModule.file = nullptr;
	modules.push_back(defaultModule);
}